

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

char * fits_split_names(char *list)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  
  pbVar2 = (byte *)fits_split_names::ptr;
  if (list == (char *)0x0) goto LAB_001303ea;
  while( true ) {
    pbVar2 = (byte *)list;
LAB_001303ea:
    bVar1 = *pbVar2;
    if (bVar1 != 0x20) break;
    list = (char *)(pbVar2 + 1);
  }
  if (bVar1 == 0) {
    fits_split_names::ptr = (char *)pbVar2;
    return (char *)0x0;
  }
  iVar4 = 0;
  fits_split_names::ptr = (char *)pbVar2;
  do {
    pbVar3 = (byte *)(fits_split_names::ptr + 1);
    if (bVar1 < 0x5d) {
      if (bVar1 < 0x29) {
        if (bVar1 == 0x28) {
LAB_00130435:
          iVar4 = iVar4 + 1;
          goto LAB_00130437;
        }
        if (bVar1 == 0) {
          return (char *)pbVar2;
        }
      }
      else {
        if (bVar1 == 0x29) goto LAB_0013042f;
        if (bVar1 == 0x5b) goto LAB_00130435;
      }
LAB_0013044a:
      if ((iVar4 == 0) && ((bVar1 == 0x2c || (iVar4 = 0, bVar1 == 0x20)))) {
        *fits_split_names::ptr = '\0';
        fits_split_names::ptr = (char *)pbVar3;
        return (char *)pbVar2;
      }
    }
    else {
      if ((bVar1 != 0x5d) && (bVar1 != 0x7d)) {
        if (bVar1 == 0x7b) goto LAB_00130435;
        goto LAB_0013044a;
      }
LAB_0013042f:
      iVar4 = iVar4 + -1;
    }
LAB_00130437:
    bVar1 = *pbVar3;
    fits_split_names::ptr = (char *)pbVar3;
  } while( true );
}

Assistant:

char *fits_split_names(
   char *list)   /* I   - input list of names */
{
/*  
   A sequence of calls to fits_split_names will split the input string
   into name tokens.  The string typically contains a list of file or
   column names.  The names must be delimited by a comma and/or spaces.
   This routine ignores spaces and commas that occur within parentheses,
   brackets, or curly brackets.  It also strips any leading and trailing
   blanks from the returned name.

   This routine is similar to the ANSI C 'strtok' function:

   The first call to fits_split_names has a non-null input string.
   It finds the first name in the string and terminates it by
   overwriting the next character of the string with a '\0' and returns
   a pointer to the name.  Each subsequent call, indicated by a NULL
   value of the input string, returns the next name, searching from
   just past the end of the previous name.  It returns NULL when no
   further names are found.

   The following line illustrates how a string would be split into 3 names:
    myfile[1][bin (x,y)=4], file2.fits  file3.fits
    ^^^^^^^^^^^^^^^^^^^^^^  ^^^^^^^^^^  ^^^^^^^^^^
      1st name               2nd name    3rd name


NOTE:  This routine is not thread-safe.  
This routine is simply provided as a utility routine for other external
software. It is not used by any CFITSIO routine.

*/
    int depth = 0;
    char *start;
    static char *ptr;

    if (list)  /* reset ptr if a string is given */
        ptr = list;

    while (*ptr == ' ')ptr++;  /* skip leading white space */

    if (*ptr == '\0')return(0);  /* no remaining file names */

    start = ptr;

    while (*ptr != '\0') {
       if ((*ptr == '[') || (*ptr == '(') || (*ptr == '{')) depth ++;
       else if ((*ptr == '}') || (*ptr == ')') || (*ptr == ']')) depth --;
       else if ((depth == 0) && (*ptr == ','  || *ptr == ' ')) {
          *ptr = '\0';  /* terminate the filename here */
          ptr++;  /* save pointer to start of next filename */
          break;  
       }
       ptr++;
    }
    
    return(start);
}